

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustnessTests.cpp
# Opt level: O1

IterateResult __thiscall
es32cts::ResetNotificationStrategy::LoseContextOnResetCase::iterate(LoseContextOnResetCase *this)

{
  ostringstream *this_00;
  RenderContext *pRVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  char *description;
  TestContext *this_01;
  bool bVar3;
  GLint reset;
  int local_19c;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  RobustnessBase::createRobustContext
            (&this->super_RobustnessBase,RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET);
  local_19c = 0;
  iVar2 = (*((this->super_RobustnessBase).m_robustContext)->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8256,&local_19c);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustnessTests.cpp"
                  ,0x9b);
  bVar3 = local_19c != 0x8252;
  if (bVar3) {
    local_198._0_8_ =
         ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Test failed! glGet returned wrong value [",0x29);
    std::ostream::operator<<(this_00,local_19c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected ",0xb);
    std::ostream::operator<<(this_00,0x8252);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"].",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    this_01 = (this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
  }
  else {
    this_01 = (this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_01,(uint)bVar3,description);
  pRVar1 = (this->super_RobustnessBase).m_robustContext;
  if (pRVar1 != (RenderContext *)0x0) {
    (*pRVar1->_vptr_RenderContext[1])();
    (this->super_RobustnessBase).m_robustContext = (RenderContext *)0x0;
    (*((this->super_RobustnessBase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[8])
              ();
  }
  return STOP;
}

Assistant:

virtual IterateResult iterate(void)
	{
		createRobustContext(glu::RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET);

		glw::GLint reset = 0;

		const glw::Functions& gl = getRobustContext()->getFunctions();
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv");

		if (reset != GL_LOSE_CONTEXT_ON_RESET)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! glGet returned wrong value [" << reset
							   << ", expected " << GL_LOSE_CONTEXT_ON_RESET << "]." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			releaseRobustContext();
			return STOP;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		releaseRobustContext();
		return STOP;
	}